

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ignoreinvalidfree.h
# Opt level: O0

void __thiscall
Hoard::
IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
::free(IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
       *this,void *__ptr)

{
  bool bVar1;
  SuperblockType *pSVar2;
  SuperblockType *s;
  void *in_stack_ffffffffffffffd8;
  
  if (((__ptr != (void *)0x0) &&
      (pSVar2 = RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
                ::getSuperblock((RedirectFree<Hoard::LockMallocHeap<Hoard::SmallHeap>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
                                 *)this,in_stack_ffffffffffffffd8), pSVar2 != (SuperblockType *)0x0)
      ) && (bVar1 = HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                    ::isValidSuperblock((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                                         *)this), bVar1)) {
    HL::
    HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>::
    free(&this->
          super_HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
         ,__ptr);
  }
  return;
}

Assistant:

INLINE void free (void * ptr) {
      if (ptr) {
	typename SuperHeap::SuperblockType * s = SuperHeap::getSuperblock (ptr);
	if (!s || (!s->isValidSuperblock())) {
	  // We encountered an invalid free, so we drop it.
	  return;
	}
	SuperHeap::free (ptr);
      }
    }